

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double * dirichlet_variance(int n,double *a)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  dVar3 = r8vec_sum(n,a);
  if (0 < n) {
    uVar2 = 0;
    do {
      pdVar1[uVar2] = ((dVar3 - a[uVar2]) * a[uVar2]) / ((dVar3 + 1.0) * dVar3 * dVar3);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return pdVar1;
}

Assistant:

double *dirichlet_variance ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_VARIANCE returns the variances of the Dirichlet PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components.
//
//    Input, double A(N), the probabilities for each component.
//    Each A(I) should be positive.
//
//    Output, double DIRICHLET_VARIANCE(N), the variances of the PDF.
//
{
  double a_sum;
  int i;
  double *variance;

  variance = new double[n];

  a_sum = r8vec_sum ( n, a );

  for ( i = 0; i < n; i++ )
  {
    variance[i] = a[i] * ( a_sum - a[i] ) / ( a_sum * a_sum * ( a_sum + 1.0 ) );
  }

  return variance;
}